

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::NodeHelper_OpenNode
          (X3DExporter *this,string *pNodeName,size_t pTabLevel,bool pEmptyElement,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pAttrList)

{
  long *plVar1;
  undefined7 in_register_00000009;
  long *plVar2;
  size_type *psVar3;
  _List_node_base *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined4 local_94;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  IndentationStringSet(this,pTabLevel);
  XML_Write(this,&this->mIndentationString);
  std::operator+(&local_b8,"<",pNodeName);
  XML_Write(this,&local_b8);
  local_94 = (undefined4)CONCAT71(in_register_00000009,pEmptyElement);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  p_Var4 = (pAttrList->
           super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)pAttrList) {
    do {
      std::operator+(&local_50," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var4 + 1));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_80 = *plVar2;
        lStack_78 = plVar1[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar2;
        local_90 = (long *)*plVar1;
      }
      local_88 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)p_Var4[3]._M_next);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_60 = *plVar2;
        lStack_58 = plVar1[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar2;
        local_70 = (long *)*plVar1;
      }
      local_68 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_b8.field_2._M_allocated_capacity = *psVar3;
        local_b8.field_2._8_8_ = plVar1[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar3;
        local_b8._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_b8._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      XML_Write(this,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var4 = (((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)pAttrList);
  }
  if ((char)local_94 == '\0') {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,">\n","");
    XML_Write(this,&local_b8);
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/>\n","");
    XML_Write(this,&local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void X3DExporter::NodeHelper_OpenNode(const string& pNodeName, const size_t pTabLevel, const bool pEmptyElement, const list<SAttribute>& pAttrList)
{
	// Write indentation.
	IndentationStringSet(pTabLevel);
	XML_Write(mIndentationString);
	// Begin of the element
	XML_Write("<" + pNodeName);
	// Write attributes
	for(const SAttribute& attr: pAttrList) { XML_Write(" " + attr.Name + "='" + attr.Value + "'"); }

	// End of the element
	if(pEmptyElement)
	{
		XML_Write("/>\n");
	}
	else
	{
		XML_Write(">\n");
	}
}